

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::AddErrorInstanceLocation
          (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *this,GValue *result,PointerType *location)

{
  Ch *s;
  StringRefType *pSVar1;
  GValue instanceRef;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> GStack_68;
  Stack<rapidjson::CrtAllocator> local_58;
  StringRefType local_20;
  
  local_58.stack_ = (char *)0x0;
  local_58.stackTop_ = (char *)0x0;
  local_58.allocator_ = (CrtAllocator *)0x0;
  local_58.ownAllocator_ = (CrtAllocator *)0x0;
  local_58.stackEnd_ = (char *)0x0;
  local_58.initialCapacity_ = 0x100;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
  ::Stringify<true,rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
            ((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
              *)location,
             (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_58);
  s = GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_58);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
            (&GStack_68,s,(int)local_58.stackTop_ - (int)local_58.stack_,this->allocator_);
  pSVar1 = GetInstanceRefString();
  local_20.s = pSVar1->s;
  local_20.length = pSVar1->length;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (result,&local_20,&GStack_68,this->allocator_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&GStack_68);
  internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_58);
  return;
}

Assistant:

void AddErrorInstanceLocation(GValue& result, const PointerType& location) {
      GenericStringBuffer<EncodingType> sb;
      location.StringifyUriFragment(sb);
      GValue instanceRef(sb.GetString(), static_cast<SizeType>(sb.GetSize() / sizeof(Ch)), *allocator_);
      result.AddMember(GetInstanceRefString(), instanceRef, *allocator_);
    }